

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void wtree_summary(wtree_object wt)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long local_38;
  
  lVar4 = (long)wt->J;
  wave_summary(wt->wave);
  putchar(10);
  printf("Wavelet Transform : %s \n",wt->method);
  putchar(10);
  printf("Signal Extension : %s \n",wt->ext);
  putchar(10);
  printf("Number of Decomposition Levels %d \n",(ulong)(uint)wt->J);
  putchar(10);
  printf("Length of Input Signal %d \n",(ulong)(uint)wt->siglength);
  putchar(10);
  printf("Length of WT Output Vector %d \n",(ulong)(uint)wt->outlength);
  putchar(10);
  printf("Wavelet Coefficients are contained in vector : %s \n","output");
  putchar(10);
  puts("Coefficients Access ");
  if (0 < lVar4) {
    iVar1 = 2;
    local_38 = 0;
    lVar3 = 0;
    do {
      lVar5 = lVar4 - local_38;
      local_38 = local_38 + 1;
      lVar3 = (long)(int)lVar3;
      uVar2 = 0;
      do {
        printf("Node %d %d Access : output[%d] Length : %d \n",local_38,(ulong)uVar2,
               (ulong)(uint)wt->nodelength[lVar3],(ulong)*(uint *)((long)wt + lVar5 * 4 + 0x50));
        lVar3 = lVar3 + 1;
        uVar2 = uVar2 + 1;
      } while (iVar1 + (uint)(iVar1 == 0) != uVar2);
      iVar1 = iVar1 * 2;
    } while (local_38 != lVar4);
  }
  putchar(10);
  return;
}

Assistant:

void wtree_summary(wtree_object wt) {
	int i,k,p2;
	int J,t;
	J = wt->J;
	wave_summary(wt->wave);
	printf("\n");
	printf("Wavelet Transform : %s \n", wt->method);
	printf("\n");
	printf("Signal Extension : %s \n", wt->ext);
	printf("\n");
	printf("Number of Decomposition Levels %d \n", wt->J);
	printf("\n");
	printf("Length of Input Signal %d \n", wt->siglength);
	printf("\n");
	printf("Length of WT Output Vector %d \n", wt->outlength);
	printf("\n");
	printf("Wavelet Coefficients are contained in vector : %s \n", "output");
	printf("\n");
	printf("Coefficients Access \n");
	t = 0;
	p2 = 2;
	for (i = 0; i < J; ++i) {
		for (k = 0; k < p2; ++k) {
			printf("Node %d %d Access : output[%d] Length : %d \n", i + 1, k, wt->nodelength[t], wt->length[J - i]);
			t++;
		}
		p2 *= 2;
	}
	printf("\n");

}